

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O2

void __thiscall soul::ValuePrinter::printFloat32(ValuePrinter *this,float value)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  char *pcVar1;
  text *in_RSI;
  ulong uStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  if ((value != 0.0) || (NAN(value))) {
    if (NAN(value)) {
      UNRECOVERED_JUMPTABLE = this->_vptr_ValuePrinter[0x13];
      pcVar1 = "_nan32";
      uStack_60 = 6;
    }
    else {
      if (ABS(value) != INFINITY) {
        choc::text::floatToString_abi_cxx11_(&local_30,in_RSI,value);
        std::operator+(&local_50,&local_30,"f");
        (*this->_vptr_ValuePrinter[0x13])(this,local_50._M_string_length,local_50._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_30);
        return;
      }
      pcVar1 = "_ninf32";
      if (0.0 < value) {
        pcVar1 = "_inf32";
      }
      uStack_60 = (ulong)(0.0 < value) ^ 7;
      UNRECOVERED_JUMPTABLE = this->_vptr_ValuePrinter[0x13];
    }
  }
  else {
    UNRECOVERED_JUMPTABLE = this->_vptr_ValuePrinter[0x13];
    pcVar1 = "0";
    uStack_60 = 1;
  }
  (*UNRECOVERED_JUMPTABLE)(this,uStack_60,pcVar1);
  return;
}

Assistant:

void ValuePrinter::printFloat32 (float value)
{
    if (value == 0)             return print ("0");
    if (std::isnan (value))     return print ("_nan32");
    if (std::isinf (value))     return print (value > 0 ? "_inf32" : "_ninf32");

    return print (choc::text::floatToString (value) + "f");
}